

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.cpp
# Opt level: O0

shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>
jaegertracing::testutils::TracerUtil::installGlobalTracer(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  ResourceHandle *this_00;
  __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var1;
  element_type *peVar2;
  ostream *poVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> sVar4;
  shared_ptr<opentracing::v3::Tracer> local_758;
  shared_ptr<opentracing::v3::Tracer> local_748;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  local_738;
  shared_ptr<jaegertracing::logging::Logger> local_730;
  allocator local_719;
  string local_718;
  undefined1 local_6f8 [8];
  shared_ptr<opentracing::v3::Tracer> tracer;
  allocator local_6c1;
  string local_6c0;
  duration local_6a0;
  allocator local_691;
  string local_690;
  RestrictionsConfig local_670;
  HeadersConfig local_640;
  allocator local_5b9;
  string local_5b8;
  IPAddress local_598;
  string local_510;
  duration local_4f0;
  Config local_4e8;
  duration local_490;
  string local_488;
  allocator local_461;
  string local_460;
  Config local_440;
  undefined1 local_3e8 [8];
  Config config;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream samplingServerURLStream;
  unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  local_18;
  unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  handle;
  
  this_00 = (ResourceHandle *)operator_new(0x10);
  ResourceHandle::ResourceHandle(this_00);
  std::
  unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>>
  ::unique_ptr<std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,void>
            ((unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>>
              *)&local_18,this_00);
  p_Var1 = (__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
              ::operator->(&local_18);
  peVar2 = std::
           __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  MockAgent::start(peVar2);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"http://");
  p_Var1 = (__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
              ::operator->(&local_18);
  peVar2 = std::
           __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  MockAgent::samplingServerAddress
            ((IPAddress *)&config._baggageRestrictions._refreshInterval,peVar2);
  net::IPAddress::authority_abi_cxx11_
            (&local_1c0,(IPAddress *)&config._baggageRestrictions._refreshInterval);
  std::operator<<(poVar3,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"const",&local_461);
  std::__cxx11::ostringstream::str();
  local_490.__r = 0;
  samplers::Config::Config(&local_440,&local_460,1.0,&local_488,0,&local_490);
  local_4f0.__r = 0;
  p_Var1 = (__shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
              ::operator->(&local_18);
  peVar2 = std::
           __shared_ptr_access<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  MockAgent::spanServerAddress(&local_598,peVar2);
  net::IPAddress::authority_abi_cxx11_(&local_510,&local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"",&local_5b9);
  reporters::Config::Config(&local_4e8,0,&local_4f0,false,&local_510,&local_5b8);
  propagation::HeadersConfig::HeadersConfig(&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_690,"",&local_691);
  local_6a0.__r = 0;
  baggage::RestrictionsConfig::RestrictionsConfig(&local_670,false,&local_690,&local_6a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"",&local_6c1);
  tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = &tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)this);
  Config::Config((Config *)local_3e8,false,&local_440,&local_4e8,&local_640,&local_670,&local_6c0,
                 (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)this);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
             &tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  baggage::RestrictionsConfig::~RestrictionsConfig(&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  propagation::HeadersConfig::~HeadersConfig(&local_640);
  reporters::Config::~Config(&local_4e8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string((string *)&local_510);
  samplers::Config::~Config(&local_440);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_718,"test-service",&local_719);
  jaegertracing::logging::nullLogger();
  std::shared_ptr<jaegertracing::logging::Logger>::
  shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
            (&local_730,&local_738);
  Tracer::make((Tracer *)local_6f8,&local_718,(Config *)local_3e8,&local_730);
  std::shared_ptr<jaegertracing::logging::Logger>::~shared_ptr(&local_730);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr(&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::shared_ptr<opentracing::v3::Tracer>::shared_ptr
            (&local_758,(shared_ptr<opentracing::v3::Tracer> *)local_6f8);
  opentracing::v3::Tracer::InitGlobal(&local_748,&local_758);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr(&local_748);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr(&local_758);
  std::shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>::
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,void>
            ((shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> *)in_RDI,&local_18);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
            ((shared_ptr<opentracing::v3::Tracer> *)local_6f8);
  Config::~Config((Config *)local_3e8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::
  unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  ::~unique_ptr(&local_18);
  sVar4.
  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.
  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>)
         sVar4.
         super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<ResourceHandle> installGlobalTracer()
{
    std::unique_ptr<ResourceHandle> handle(new ResourceHandle());
    handle->_mockAgent->start();
    std::ostringstream samplingServerURLStream;
    samplingServerURLStream
        << "http://" << handle->_mockAgent->samplingServerAddress().authority();
    Config config(
        false,
        samplers::Config("const",
                         1,
                         samplingServerURLStream.str(),
                         0,
                         samplers::Config::Clock::duration()),
        reporters::Config(0,
                          reporters::Config::Clock::duration(),
                          false,
                          handle->_mockAgent->spanServerAddress().authority()),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig());

    auto tracer = Tracer::make("test-service", config, logging::nullLogger());
    opentracing::Tracer::InitGlobal(tracer);
    return std::move(handle);
}